

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O0

string * common::FeeModes(string *delimiter)

{
  long lVar1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>_>
  *pvVar2;
  undefined8 in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar2 = FeeModeMap_abi_cxx11_();
  util::
  Join<std::vector<std::pair<std::__cxx11::string,FeeEstimateMode>,std::allocator<std::pair<std::__cxx11::string,FeeEstimateMode>>>,std::__cxx11::string,common::FeeModes(std::__cxx11::string_const&)::__0>
            (in_RDI,pvVar2,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string FeeModes(const std::string& delimiter)
{
    return Join(FeeModeMap(), delimiter, [&](const std::pair<std::string, FeeEstimateMode>& i) { return i.first; });
}